

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * hd_malloc(hd_context *ctx,size_t size)

{
  void *p;
  size_t size_local;
  hd_context *ctx_local;
  
  if (size == 0) {
    ctx_local = (hd_context *)0x0;
  }
  else {
    ctx_local = (hd_context *)do_scavenging_malloc(ctx,size);
    if (ctx_local == (hd_context *)0x0) {
      hd_throw(ctx,1,"malloc of %zu bytes failed",size);
    }
  }
  return ctx_local;
}

Assistant:

void *
hd_malloc(hd_context *ctx, size_t size)
{
    void *p;

    if (size == 0)
        return NULL;

    p = do_scavenging_malloc(ctx, size);
    if (!p)
        hd_throw(ctx, HD_ERROR_MEMORY, "malloc of " FMT_zu " bytes failed", size);
    return p;
}